

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O0

void print_help(void)

{
  fprintf(_stderr,
          "Fossilize INFO: fossilize-disasm\n\t[--help]\n\t[--device-index <index>]\n\t[--enable-validation]\n\t[--output <path>]\n\t[--target asm/glsl/isa]\n\t[--module-only]\n\t[--filter-graphics hash]\n\t[--filter-compute hash]\n\t[--filter-raytracing hash]\n\t[--filter-module hash]\n\t[--disasm-match <pattern>]\nstate.json\n"
         );
  fflush(_stderr);
  return;
}

Assistant:

static void print_help()
{
	LOGI("fossilize-disasm\n"
	     "\t[--help]\n"
	     "\t[--device-index <index>]\n"
	     "\t[--enable-validation]\n"
	     "\t[--output <path>]\n"
	     "\t[--target asm/glsl/isa]\n"
	     "\t[--module-only]\n"
	     "\t[--filter-graphics hash]\n"
	     "\t[--filter-compute hash]\n"
	     "\t[--filter-raytracing hash]\n"
	     "\t[--filter-module hash]\n"
		 "\t[--disasm-match <pattern>]\n"
	     "state.json\n");
}